

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.c
# Opt level: O1

int SolveProblem(ProgramArgs *args,ProblemResult *result,SUNContext sunctx)

{
  double dVar1;
  int iVar2;
  sunrealtype sVar3;
  undefined8 uVar4;
  ProblemResult *pPVar5;
  uint uVar6;
  int iVar7;
  int extraout_EAX;
  int iVar8;
  N_Vector yvec;
  undefined8 *puVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  FILE *__stream;
  double *pdVar12;
  char *pcVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar14;
  longdouble lVar15;
  undefined4 uVar16;
  double dVar17;
  void *arkode_mem;
  int rootsfound;
  sunrealtype tret;
  undefined8 local_240;
  char *local_238;
  int local_230;
  longdouble local_22c;
  double local_220;
  uint local_214;
  double local_210;
  longdouble local_204;
  sunrealtype local_1f8;
  undefined8 *local_1f0;
  FILE *local_1e8;
  FILE *local_1e0;
  FILE *local_1d8;
  double local_1d0;
  undefined8 local_1c8;
  ProblemResult *local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  sunrealtype local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  sunrealtype local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138 [33];
  
  local_240 = 0;
  local_214 = 0;
  iVar8 = args->count_orbits;
  local_210 = (double)CONCAT44(local_210._4_4_,args->step_mode);
  iVar7 = args->stepper;
  iVar2 = args->use_compsums;
  local_230 = args->num_output_times;
  local_238 = args->method_name;
  dVar1 = args->dt;
  local_1f8 = args->tf;
  local_1c0 = result;
  puts("\n   Begin Kepler Problem\n");
  fwrite("Problem Arguments:\n",0x13,1,_stdout);
  fprintf(_stdout,"  stepper:              %d\n",(ulong)(uint)args->stepper);
  fprintf(_stdout,"  step mode:            %d\n",(ulong)(uint)args->step_mode);
  fprintf(_stdout,"  use tstop:            %d\n",(ulong)(uint)args->use_tstop);
  fprintf(_stdout,"  use compensated sums: %d\n",(ulong)(uint)args->use_compsums);
  fprintf(_stdout,"  dt:                   %Lg\n");
  fprintf(_stdout,"  Tf:                   %Lg\n");
  fprintf(_stdout,"  nout:                 %d\n\n",(ulong)(uint)args->num_output_times);
  local_1f0 = (undefined8 *)malloc(8);
  *local_1f0 = 0x3fe3333333333333;
  yvec = (N_Vector)N_VNew_Serial(4,sunctx);
  local_1c8 = N_VGetArrayPointer(yvec);
  puVar9 = (undefined8 *)N_VGetArrayPointer(yvec);
  *puVar9 = 0x3fd999999999999a;
  puVar9[1] = 0;
  puVar9[2] = 0;
  puVar9[3] = 0x4000000000000000;
  uVar16 = SUB84(dVar1,0);
  if (iVar7 == 0) {
    local_240 = SPRKStepCreate(0,force,velocity,yvec,sunctx);
    if (iVar8 != 0) {
      ARKodeRootInit(local_240,1,rootfn);
    }
    uVar6 = SPRKStepSetMethodName(local_240,local_238);
    if ((int)uVar6 < 0) {
      pcVar13 = "SPRKStepSetMethodName";
      goto LAB_00103e42;
    }
    uVar6 = SPRKStepSetUseCompensatedSums(local_240,iVar2);
    if ((int)uVar6 < 0) {
      pcVar13 = "SPRKStepSetUseCompensatedSums";
      goto LAB_00103e42;
    }
    if (local_210._0_4_ != 0) {
      SolveProblem_cold_1();
      return extraout_EAX;
    }
    uVar6 = ARKodeSetFixedStep(uVar16,local_240);
    uVar4 = local_240;
    if ((int)uVar6 < 0) {
      pcVar13 = "ARKodeSetFixedStep";
      goto LAB_00103e42;
    }
    dVar1 = ceil(local_1f8 / dVar1);
    uVar6 = ARKodeSetMaxNumSteps(uVar4,(long)dVar1 + 1);
    if ((int)uVar6 < 0) {
LAB_00103dd3:
      pcVar13 = "ARKodeSetMaxNumSteps";
LAB_00103e42:
      iVar8 = fprintf(_stderr,"\nERROR: %s() failed with retval = %d\n\n",pcVar13,(ulong)uVar6);
      return iVar8;
    }
    uVar6 = ARKodeSetUserData(local_240,local_1f0);
    if ((int)uVar6 < 0) goto LAB_00103509;
  }
  else if (iVar7 == 1) {
    local_240 = ARKStepCreate(0,dydt,0,yvec,sunctx);
    uVar6 = ARKStepSetTableName(local_240,"ARKODE_DIRK_NONE",local_238);
    if ((int)uVar6 < 0) {
      pcVar13 = "ARKStepSetTableName";
      goto LAB_00103e42;
    }
    if ((iVar8 != 0) && (ARKodeRootInit(local_240,1,rootfn), (int)uVar6 < 0)) {
      pcVar13 = "ARKodeRootInit";
      goto LAB_00103e42;
    }
    uVar6 = ARKodeSetUserData(local_240,local_1f0);
    uVar4 = local_240;
    if ((int)uVar6 < 0) {
LAB_00103509:
      pcVar13 = "ARKodeSetUserData";
      goto LAB_00103e42;
    }
    dVar17 = ceil(local_1f8 / dVar1);
    uVar6 = ARKodeSetMaxNumSteps(uVar4,(long)dVar17 + 1);
    if ((int)uVar6 < 0) goto LAB_00103dd3;
    if (local_210._0_4_ == 0) {
      ARKodeSetFixedStep(uVar16,local_240);
    }
    else {
      uVar6 = ARKodeSStolerances(uVar16,dVar1);
      if ((int)uVar6 < 0) {
        pcVar13 = "ARKodeSStolerances";
        goto LAB_00103e42;
      }
    }
  }
  pcVar13 = local_238;
  local_1d0 = local_1f8 / (double)local_230;
  local_220 = (double)CONCAT44(local_220._4_4_,iVar7);
  if (iVar7 == 0) {
    sprintf((char *)local_138,"ark_kepler_conserved_%s-dt-%.2e.txt",uVar16,local_238);
    pFVar10 = fopen((char *)local_138,"w+");
    sprintf((char *)local_138,"ark_kepler_solution_%s-dt-%.2e.txt",uVar16,pcVar13);
    pFVar11 = fopen((char *)local_138,"w+");
  }
  else {
    sprintf((char *)local_138,"ark_kepler_conserved_%s-dt-%.2e.txt",uVar16,local_238);
    pFVar10 = fopen((char *)local_138,"w+");
    sprintf((char *)local_138,"ark_kepler_solution_%s-dt-%.2e.txt",uVar16,pcVar13);
    pFVar11 = fopen((char *)local_138,"w+");
  }
  sprintf((char *)local_138,"ark_kepler_times_%s-dt-%.2e.txt",uVar16,pcVar13);
  __stream = fopen((char *)local_138,"w+");
  local_138[0] = 0.0;
  local_238 = (char *)Hamiltonian(yvec);
  pdVar12 = (double *)N_VGetArrayPointer(yvec);
  local_210 = *pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1];
  local_140 = (double)local_238;
  lVar14 = (longdouble)(double)local_238;
  local_22c = (longdouble)local_210;
  local_148 = local_210;
  fprintf(_stdout,"t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n");
  fprintf(__stream,"%.16Lf\n");
  lVar15 = local_22c;
  local_1d8 = pFVar10;
  fprintf(pFVar10,"%.16Lf, %.16Lf\n");
  N_VPrintFile(yvec,pFVar11);
  dVar1 = local_1d0 + 0.0;
  local_1e8 = __stream;
  local_1e0 = pFVar11;
  if (local_220._0_4_ == 0) {
    if (0 < local_230) {
      local_220 = 0.0;
      iVar8 = 0;
      do {
        if (args->use_tstop != 0) {
          ARKodeSetStopTime(SUB84(dVar1,0),local_240);
        }
        iVar7 = ARKodeEvolve(SUB84(dVar1,0),local_240,yvec,local_138,1,in_R8,in_R9,lVar14,lVar15);
        pFVar10 = _stdout;
        if (iVar7 == 2) {
          local_220 = local_220 + 0.5;
          fwrite("ROOT RETURN:\t",0xd,1,_stdout);
          ARKodeGetRootInfo(local_240,&local_214);
          local_1a8 = local_220;
          fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                  (ulong)local_214);
          pFVar10 = _stdout;
          local_22c = (longdouble)local_138[0];
          sVar3 = Hamiltonian(yvec);
          local_1b0 = sVar3 - (double)local_238;
          local_204 = (longdouble)local_1b0;
          pdVar12 = (double *)N_VGetArrayPointer(yvec);
          local_1b8 = (*pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1]) - local_210;
          lVar14 = local_22c;
          lVar15 = local_204;
          fprintf(pFVar10,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        }
        else {
          if (iVar7 < 0) goto LAB_00103e74;
          local_22c = (longdouble)local_138[0];
          sVar3 = Hamiltonian(yvec);
          local_188 = sVar3 - (double)local_238;
          local_204 = (longdouble)local_188;
          pdVar12 = (double *)N_VGetArrayPointer(yvec);
          local_190 = (*pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1]) - local_210;
          fprintf(pFVar10,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
          fprintf(local_1e8,"%.16Lf\n");
          local_198 = Hamiltonian(yvec);
          local_22c = (longdouble)local_198;
          pdVar12 = (double *)N_VGetArrayPointer(yvec);
          local_1a0 = *pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1];
          lVar15 = (longdouble)local_1a0;
          lVar14 = local_22c;
          fprintf(local_1d8,"%.16Lf, %.16Lf\n");
          N_VPrintFile(yvec,local_1e0);
          dVar17 = dVar1 + local_1d0;
          dVar1 = local_1f8;
          if (dVar17 <= local_1f8) {
            dVar1 = dVar17;
          }
          iVar8 = iVar8 + 1;
        }
      } while (iVar8 < local_230);
    }
  }
  else if (0 < local_230) {
    local_220 = 0.0;
    iVar8 = 0;
    do {
      if (args->use_tstop != 0) {
        ARKodeSetStopTime(SUB84(dVar1,0),local_240);
      }
      iVar7 = ARKodeEvolve(SUB84(dVar1,0),local_240,yvec,local_138,1,in_R8,in_R9,lVar14,lVar15);
      pFVar10 = _stdout;
      if (iVar7 == 2) {
        local_220 = local_220 + 0.5;
        fwrite("ROOT RETURN:\t",0xd,1,_stdout);
        ARKodeGetRootInfo(local_240,&local_214);
        local_170 = local_220;
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)local_214);
        pFVar10 = _stdout;
        local_22c = (longdouble)local_138[0];
        sVar3 = Hamiltonian(yvec);
        local_178 = sVar3 - (double)local_238;
        local_204 = (longdouble)local_178;
        pdVar12 = (double *)N_VGetArrayPointer(yvec);
        local_180 = (*pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1]) - local_210;
        lVar14 = local_22c;
        lVar15 = local_204;
        fprintf(pFVar10,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
      }
      else {
        if (iVar7 < 0) goto LAB_00103e74;
        local_22c = (longdouble)local_138[0];
        sVar3 = Hamiltonian(yvec);
        local_150 = sVar3 - (double)local_238;
        local_204 = (longdouble)local_150;
        pdVar12 = (double *)N_VGetArrayPointer(yvec);
        local_158 = (*pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1]) - local_210;
        fprintf(pFVar10,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        fprintf(local_1e8,"%.16Lf\n");
        local_160 = Hamiltonian(yvec);
        local_22c = (longdouble)local_160;
        pdVar12 = (double *)N_VGetArrayPointer(yvec);
        local_168 = *pdVar12 * pdVar12[3] - pdVar12[2] * pdVar12[1];
        lVar15 = (longdouble)local_168;
        lVar14 = local_22c;
        fprintf(local_1d8,"%.16Lf, %.16Lf\n");
        N_VPrintFile(yvec,local_1e0);
        dVar17 = dVar1 + local_1d0;
        dVar1 = local_1f8;
        if (dVar17 <= local_1f8) {
          dVar1 = dVar17;
        }
        iVar8 = iVar8 + 1;
      }
    } while (iVar8 < local_230);
  }
LAB_00103d36:
  pPVar5 = local_1c0;
  N_VScale(0,yvec,local_1c0->sol);
  sVar3 = Hamiltonian(yvec);
  pPVar5->energy_error = sVar3 - (double)local_238;
  free(local_1f0);
  fclose(local_1e8);
  fclose(local_1d8);
  fclose(local_1e0);
  N_VDestroy(yvec);
  ARKodePrintAllStats(local_240,_stdout,0);
  iVar8 = ARKodeFree(&local_240);
  return iVar8;
LAB_00103e74:
  SolveProblem_cold_2();
  goto LAB_00103d36;
}

Assistant:

int SolveProblem(ProgramArgs* args, ProblemResult* result, SUNContext sunctx)
{
  void* arkode_mem       = NULL;
  N_Vector y             = NULL;
  SUNNonlinearSolver NLS = NULL;
  UserData udata         = NULL;
  sunrealtype* ydata     = NULL;
  sunrealtype num_orbits = 0;
  FILE* conserved_fp     = NULL;
  FILE* solution_fp      = NULL;
  FILE* times_fp         = NULL;
  int rootsfound         = 0;
  int iout               = 0;
  int retval             = 0;

  const int count_orbits     = args->count_orbits;
  const int step_mode        = args->step_mode;
  const int stepper          = args->stepper;
  const int use_compsums     = args->use_compsums;
  const int num_output_times = args->num_output_times;
  const char* method_name    = args->method_name;
  const sunrealtype dt       = args->dt;
  sunrealtype Tf             = args->tf;

  /* Default problem parameters */
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype dTout = (Tf - T0) / ((sunrealtype)num_output_times);
  const sunrealtype ecc   = SUN_RCONST(0.6);

  printf("\n   Begin Kepler Problem\n\n");
  PrintArgs(args);

  /* Allocate and fill udata structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->ecc = ecc;

  /* Allocate our state vector */
  y     = N_VNew_Serial(4, sunctx);
  ydata = N_VGetArrayPointer(y);

  /* Fill the initial conditions */
  InitialConditions(y, ecc);

  /* Create SPRKStep integrator */
  if (stepper == 0)
  {
    arkode_mem = SPRKStepCreate(force, velocity, T0, y, sunctx);

    /* Optional: enable temporal root-finding */
    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = SPRKStepSetMethodName(arkode_mem, method_name);
    if (check_retval(&retval, "SPRKStepSetMethodName", 1)) { return 1; }

    retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
    if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

    if (step_mode == 0)
    {
      retval = ARKodeSetFixedStep(arkode_mem, dt);
      if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

      retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
      if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }
    }
    else
    {
      fprintf(stderr,
              "ERROR: adaptive time-steps are not supported with SPRKStep\n");
      return 1;
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  }
  else if (stepper == 1)
  {
    arkode_mem = ARKStepCreate(dydt, NULL, T0, y, sunctx);

    retval = ARKStepSetTableName(arkode_mem, "ARKODE_DIRK_NONE", method_name);
    if (check_retval(&retval, "ARKStepSetTableName", 1)) { return 1; }

    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

    retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
    if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

    if (step_mode == 0) { retval = ARKodeSetFixedStep(arkode_mem, dt); }
    else
    {
      retval = ARKodeSStolerances(arkode_mem, dt, dt);
      if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }
    }
  }

  /* Open output files */
  if (stepper == 0)
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }
  else
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  sunrealtype H0   = Hamiltonian(y);
  sunrealtype L0   = AngularMomentum(y);
  fprintf(stdout, "t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n",
          (long double)tret, (long double)H0, (long double)L0);
  fprintf(times_fp, "%.16Lf\n", (long double)tret);
  fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)H0, (long double)L0);
  N_VPrintFile(y, solution_fp);

  /* Do integration */
  if (stepper == 0)
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }
  else
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }

  /* Copy results */
  N_VScale(SUN_RCONST(1.0), y, result->sol);
  result->energy_error = Hamiltonian(y) - H0;

  free(udata);
  fclose(times_fp);
  fclose(conserved_fp);
  fclose(solution_fp);
  if (NLS) { SUNNonlinSolFree(NLS); }
  N_VDestroy(y);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  return 0;
}